

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_bagwell.h
# Opt level: O0

void __thiscall
vector_bagwell<unsigned_char_*,_16U>::clear(vector_bagwell<unsigned_char_*,_16U> *this)

{
  size_type sVar1;
  reference pppuVar2;
  uint local_14;
  uint i;
  vector_bagwell<unsigned_char_*,_16U> *this_local;
  
  local_14 = 0;
  while( true ) {
    sVar1 = std::vector<unsigned_char_**,_std::allocator<unsigned_char_**>_>::size
                      (&this->_index_block);
    if (sVar1 <= local_14) break;
    pppuVar2 = std::vector<unsigned_char_**,_std::allocator<unsigned_char_**>_>::operator[]
                         (&this->_index_block,(ulong)local_14);
    free(*pppuVar2);
    local_14 = local_14 + 1;
  }
  std::vector<unsigned_char_**,_std::allocator<unsigned_char_**>_>::clear(&this->_index_block);
  this->_insertpos = (uchar **)0x0;
  this->_left_in_block = 0;
  return;
}

Assistant:

void clear()
	{
		for (unsigned i=0; i < _index_block.size(); ++i) {
			free(_index_block[i]);
		}
		_index_block.clear();
		_insertpos = 0;
		_left_in_block = 0;
	}